

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O0

int oonf_subsystem_init(void)

{
  int iVar1;
  oonf_libdata *poVar2;
  int local_c;
  
  iVar1 = abuf_init(&_dlopen_data_buffer);
  if (iVar1 == 0) {
    _init_plugin_tree();
    poVar2 = oonf_log_get_libdata();
    _dlopen_data[2].value = poVar2->sharedlibrary_prefix;
    poVar2 = oonf_log_get_libdata();
    _dlopen_data[3].value = poVar2->sharedlibrary_postfix;
    poVar2 = oonf_log_get_libdata();
    _dlopen_data[4].value = poVar2->version;
    local_c = 0;
  }
  else {
    local_c = -1;
  }
  return local_c;
}

Assistant:

int
oonf_subsystem_init(void) {
  if (abuf_init(&_dlopen_data_buffer)) {
    return -1;
  }

  _init_plugin_tree();

  /* load predefined values for dlopen templates */
  _dlopen_data[IDX_DLOPEN_PRE].value = oonf_log_get_libdata()->sharedlibrary_prefix;
  _dlopen_data[IDX_DLOPEN_POST].value = oonf_log_get_libdata()->sharedlibrary_postfix;
  _dlopen_data[IDX_DLOPEN_VER].value = oonf_log_get_libdata()->version;
  return 0;
}